

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rudp.hpp
# Opt level: O2

void __thiscall
rudp::rudp_server::send<unsigned_char*>
          (rudp_server *this,uint32_t session_id,uchar *begin,uchar *end,function<void_(bool)> *cb)

{
  iterator iVar1;
  iterator iVar2;
  key_type local_24;
  
  iVar1 = std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::_Select1st<std::pair<const_unsigned_int,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
          ::find(&(this->session_bindings)._M_t,&local_24);
  if ((((_Rb_tree_header *)iVar1._M_node !=
        &(this->session_bindings)._M_t._M_impl.super__Rb_tree_header) &&
      (iVar2 = std::
               _Rb_tree<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::pair<const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::shared_ptr<rudp::session>_>,_std::_Select1st<std::pair<const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::shared_ptr<rudp::session>_>_>,_std::less<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::shared_ptr<rudp::session>_>_>_>
               ::find(&(this->sessions)._M_t,(key_type *)&iVar1._M_node[1].field_0x4),
      (_Rb_tree_header *)iVar2._M_node != &(this->sessions)._M_t._M_impl.super__Rb_tree_header)) &&
     (*(session **)(iVar2._M_node + 2) != (session *)0x0)) {
    session::send<unsigned_char*>(*(session **)(iVar2._M_node + 2),begin,end,cb);
    return;
  }
  std::function<void_(bool)>::operator()(cb,false);
  return;
}

Assistant:

void send(
    uint32_t session_id,
    Iterator begin, Iterator end,
    const std::function< void( bool ) > &cb
  ) {
    auto endpoint = session_bindings.find( session_id );
    if( endpoint != session_bindings.end() ) {
      auto sess = sessions.find( endpoint->second );
      if( sess != sessions.end() && sess->second )
        sess->second->send( begin, end, cb );
      else cb( false );
    }
    else cb( false );
  }